

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtabbar.cpp
# Opt level: O0

void QTabBar::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  QTabBar *this;
  bool bVar2;
  Shape SVar3;
  int iVar4;
  TextElideMode TVar5;
  SelectionBehavior SVar6;
  QSize QVar7;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QTabBar *_t;
  QTabBar *in_stack_ffffffffffffff58;
  QTabBar *in_stack_ffffffffffffff60;
  QSize *in_stack_ffffffffffffff68;
  QTabBar *in_stack_ffffffffffffff70;
  QSize *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 closable;
  QTabBar *in_stack_ffffffffffffffc8;
  
  closable = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff68 = (QSize *)(ulong)in_EDX;
    iVar4 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    switch(in_stack_ffffffffffffff68) {
    case (QSize *)0x0:
      currentChanged((QTabBar *)0x6b4499,iVar4);
      break;
    case (QSize *)0x1:
      tabCloseRequested((QTabBar *)0x6b44b6,iVar4);
      break;
    case (QSize *)0x2:
      tabMoved((QTabBar *)0x6b44de,iVar4,(int)in_stack_ffffffffffffff58);
      break;
    case (QSize *)0x3:
      tabBarClicked((QTabBar *)0x6b44f8,iVar4);
      break;
    case (QSize *)0x4:
      tabBarDoubleClicked((QTabBar *)0x6b4512,iVar4);
      break;
    case (QSize *)0x5:
      setCurrentIndex((QTabBar *)in_stack_ffffffffffffff78,
                      (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    }
  }
  if (in_ESI == 5) {
    closable = 0;
    in_stack_ffffffffffffffc8 = (QTabBar *)0x0;
    bVar2 = QtMocHelpers::indexOfMethod<void(QTabBar::*)(int)>(in_RCX,(void **)currentChanged,0,0);
    if ((((bVar2) ||
         (bVar2 = QtMocHelpers::indexOfMethod<void(QTabBar::*)(int)>
                            (in_RCX,(void **)tabCloseRequested,0,1), bVar2)) ||
        (bVar2 = QtMocHelpers::indexOfMethod<void(QTabBar::*)(int,int)>
                           (in_RCX,(void **)tabMoved,0,2), bVar2)) ||
       ((bVar2 = QtMocHelpers::indexOfMethod<void(QTabBar::*)(int)>
                           (in_RCX,(void **)tabBarClicked,0,3), bVar2 ||
        (bVar2 = QtMocHelpers::indexOfMethod<void(QTabBar::*)(int)>
                           (in_RCX,(void **)tabBarDoubleClicked,0,4), bVar2)))) goto LAB_006b499c;
  }
  if (in_ESI == 1) {
    in_stack_ffffffffffffff78 = *(QSize **)in_RCX;
    in_stack_ffffffffffffff60 = (QTabBar *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff60) {
    case (QTabBar *)0x0:
      SVar3 = shape(in_stack_ffffffffffffff60);
      (in_stack_ffffffffffffff78->wd).m_i = SVar3;
      break;
    case (QTabBar *)0x1:
      iVar4 = currentIndex(in_stack_ffffffffffffff58);
      (in_stack_ffffffffffffff78->wd).m_i = iVar4;
      break;
    case (QTabBar *)0x2:
      iVar4 = count(in_stack_ffffffffffffff60);
      (in_stack_ffffffffffffff78->wd).m_i = iVar4;
      break;
    case (QTabBar *)0x3:
      bVar2 = drawBase(in_stack_ffffffffffffff60);
      *(bool *)&(in_stack_ffffffffffffff78->wd).m_i = bVar2;
      break;
    case (QTabBar *)0x4:
      QVar7 = iconSize(in_stack_ffffffffffffff70);
      *in_stack_ffffffffffffff78 = QVar7;
      break;
    case (QTabBar *)0x5:
      TVar5 = elideMode(in_stack_ffffffffffffff60);
      (in_stack_ffffffffffffff78->wd).m_i = TVar5;
      break;
    case (QTabBar *)0x6:
      bVar2 = usesScrollButtons((QTabBar *)0x6b4761);
      *(bool *)&(in_stack_ffffffffffffff78->wd).m_i = bVar2;
      break;
    case (QTabBar *)0x7:
      bVar2 = tabsClosable(in_stack_ffffffffffffff60);
      *(bool *)&(in_stack_ffffffffffffff78->wd).m_i = bVar2;
      break;
    case (QTabBar *)0x8:
      SVar6 = selectionBehaviorOnRemove(in_stack_ffffffffffffff60);
      (in_stack_ffffffffffffff78->wd).m_i = SVar6;
      break;
    case (QTabBar *)0x9:
      bVar2 = expanding(in_stack_ffffffffffffff60);
      *(bool *)&(in_stack_ffffffffffffff78->wd).m_i = bVar2;
      break;
    case (QTabBar *)0xa:
      bVar2 = isMovable(in_stack_ffffffffffffff60);
      *(bool *)&(in_stack_ffffffffffffff78->wd).m_i = bVar2;
      break;
    case (QTabBar *)0xb:
      bVar2 = documentMode((QTabBar *)0x6b47dc);
      *(bool *)&(in_stack_ffffffffffffff78->wd).m_i = bVar2;
      break;
    case (QTabBar *)0xc:
      bVar2 = autoHide(in_stack_ffffffffffffff60);
      *(bool *)&(in_stack_ffffffffffffff78->wd).m_i = bVar2;
      break;
    case (QTabBar *)0xd:
      bVar2 = changeCurrentOnDrag(in_stack_ffffffffffffff60);
      *(bool *)&(in_stack_ffffffffffffff78->wd).m_i = bVar2;
    }
  }
  if (in_ESI == 2) {
    this = *(QTabBar **)in_RCX;
    bVar2 = SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0);
    switch(in_EDX) {
    case 0:
      setShape(in_stack_ffffffffffffff60,RoundedNorth);
      break;
    case 1:
      setCurrentIndex((QTabBar *)in_stack_ffffffffffffff78,(int)((ulong)this >> 0x20));
      break;
    default:
      break;
    case 3:
      setDrawBase(this,bVar2);
      break;
    case 4:
      setIconSize(this,in_stack_ffffffffffffff68);
      break;
    case 5:
      setElideMode(in_stack_ffffffffffffff60,ElideLeft);
      break;
    case 6:
      setUsesScrollButtons(in_stack_ffffffffffffff60,false);
      break;
    case 7:
      setTabsClosable(in_stack_ffffffffffffffc8,(bool)closable);
      break;
    case 8:
      setSelectionBehaviorOnRemove(in_stack_ffffffffffffff60,SelectLeftTab);
      break;
    case 9:
      setExpanding(in_stack_ffffffffffffff60,false);
      break;
    case 10:
      setMovable(in_stack_ffffffffffffff60,false);
      break;
    case 0xb:
      setDocumentMode(in_stack_ffffffffffffff60,false);
      break;
    case 0xc:
      setAutoHide(this,bVar2);
      break;
    case 0xd:
      setChangeCurrentOnDrag(in_stack_ffffffffffffff60,false);
    }
  }
LAB_006b499c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBar::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTabBar *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->tabCloseRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->tabMoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->tabBarClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->tabBarDoubleClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::currentChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::tabCloseRequested, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int , int )>(_a, &QTabBar::tabMoved, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::tabBarClicked, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTabBar::*)(int )>(_a, &QTabBar::tabBarDoubleClicked, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Shape*>(_v) = _t->shape(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->count(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->drawBase(); break;
        case 4: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 5: *reinterpret_cast<Qt::TextElideMode*>(_v) = _t->elideMode(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->usesScrollButtons(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->tabsClosable(); break;
        case 8: *reinterpret_cast<SelectionBehavior*>(_v) = _t->selectionBehaviorOnRemove(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->expanding(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->isMovable(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->documentMode(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->autoHide(); break;
        case 13: *reinterpret_cast<bool*>(_v) = _t->changeCurrentOnDrag(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setShape(*reinterpret_cast<Shape*>(_v)); break;
        case 1: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setDrawBase(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 5: _t->setElideMode(*reinterpret_cast<Qt::TextElideMode*>(_v)); break;
        case 6: _t->setUsesScrollButtons(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setTabsClosable(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setSelectionBehaviorOnRemove(*reinterpret_cast<SelectionBehavior*>(_v)); break;
        case 9: _t->setExpanding(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setMovable(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setDocumentMode(*reinterpret_cast<bool*>(_v)); break;
        case 12: _t->setAutoHide(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setChangeCurrentOnDrag(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}